

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_miniz.cpp
# Opt level: O0

mz_bool tdefl_compress_lz_codes(tdefl_compressor *d)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  byte *pbVar4;
  mz_uint8 *pmVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  byte *pbVar12;
  byte *pbVar13;
  uint local_80;
  uint local_7c;
  uint local_78;
  mz_uint len_1;
  mz_uint bits_1;
  mz_uint len;
  mz_uint bits;
  mz_uint32 n;
  mz_uint lit;
  mz_uint match_dist;
  mz_uint match_len;
  mz_uint num_extra_bits;
  mz_uint sym;
  mz_uint n1;
  mz_uint n0;
  mz_uint s1;
  mz_uint s0;
  mz_uint bits_in;
  mz_uint64 bit_buffer;
  mz_uint8 *pLZ_code_buf_end;
  mz_uint8 *pOutput_buf;
  mz_uint8 *pLZ_codes;
  mz_uint flags;
  tdefl_compressor *d_local;
  
  pOutput_buf = d->m_pOutput_buf;
  pbVar4 = d->m_pLZ_code_buf;
  bit_buffer = (mz_uint64)d->m_bit_buffer;
  bits_in = d->m_bits_in;
  flags = 1;
  pLZ_codes = d->m_lz_code_buf;
  while( true ) {
    if (pbVar4 <= pLZ_codes) {
      d->m_pOutput_buf = pOutput_buf;
      d->m_bits_in = 0;
      d->m_bit_buffer = 0;
      for (; bits_in != 0; bits_in = bits_in - local_80) {
        if (bits_in < 0x10) {
          local_80 = bits_in;
        }
        else {
          local_80 = 0x10;
        }
        d->m_bit_buffer =
             ((uint)bit_buffer & mz_bitmasks[local_80]) << ((byte)d->m_bits_in & 0x1f) |
             d->m_bit_buffer;
        d->m_bits_in = local_80 + d->m_bits_in;
        while (7 < d->m_bits_in) {
          if (d->m_pOutput_buf < d->m_pOutput_buf_end) {
            pmVar5 = d->m_pOutput_buf;
            d->m_pOutput_buf = pmVar5 + 1;
            *pmVar5 = (mz_uint8)d->m_bit_buffer;
          }
          d->m_bit_buffer = d->m_bit_buffer >> 8;
          d->m_bits_in = d->m_bits_in - 8;
        }
        bit_buffer = bit_buffer >> ((byte)local_80 & 0x3f);
      }
      bVar1 = d->m_huff_code_sizes[0][0x100];
      d->m_bit_buffer =
           (uint)d->m_huff_codes[0][0x100] << ((byte)d->m_bits_in & 0x1f) | d->m_bit_buffer;
      d->m_bits_in = (uint)bVar1 + d->m_bits_in;
      while (7 < d->m_bits_in) {
        if (d->m_pOutput_buf < d->m_pOutput_buf_end) {
          pmVar5 = d->m_pOutput_buf;
          d->m_pOutput_buf = pmVar5 + 1;
          *pmVar5 = (mz_uint8)d->m_bit_buffer;
        }
        d->m_bit_buffer = d->m_bit_buffer >> 8;
        d->m_bits_in = d->m_bits_in - 8;
      }
      return (uint)(d->m_pOutput_buf < d->m_pOutput_buf_end);
    }
    if (flags == 1) {
      flags = *pLZ_codes | 0x100;
      pLZ_codes = pLZ_codes + 1;
    }
    uVar11 = flags;
    if ((flags & 1) == 0) {
      pbVar12 = pLZ_codes + 1;
      bit_buffer = (ulong)d->m_huff_codes[0][(uint)*pLZ_codes] << ((byte)bits_in & 0x3f) |
                   bit_buffer;
      bits_in = d->m_huff_code_sizes[0][(uint)*pLZ_codes] + bits_in;
      if (((flags & 2) == 0) && (pbVar12 < pbVar4)) {
        uVar11 = flags >> 1;
        pbVar13 = pLZ_codes + 2;
        bit_buffer = (ulong)d->m_huff_codes[0][(uint)*pbVar12] << ((byte)bits_in & 0x3f) |
                     bit_buffer;
        bits_in = d->m_huff_code_sizes[0][(uint)*pbVar12] + bits_in;
        pbVar12 = pbVar13;
        if (((uVar11 & 2) == 0) && (pbVar13 < pbVar4)) {
          bit_buffer = (ulong)d->m_huff_codes[0][(uint)*pbVar13] << ((byte)bits_in & 0x3f) |
                       bit_buffer;
          bits_in = d->m_huff_code_sizes[0][(uint)*pbVar13] + bits_in;
          pbVar12 = pLZ_codes + 3;
          uVar11 = flags >> 2;
        }
      }
    }
    else {
      uVar6 = (uint)*pLZ_codes;
      uVar3 = *(ushort *)(pLZ_codes + 1);
      uVar7 = (uint)uVar3;
      iVar8 = d->m_huff_code_sizes[0][s_tdefl_len_sym[uVar6]] + bits_in;
      iVar9 = (uint)""[uVar6] + iVar8;
      bVar1 = ""[uVar3 >> 8];
      bVar2 = ""[uVar3 >> 8];
      if (uVar7 < 0x200) {
        bVar1 = ""[uVar7 & 0x1ff];
      }
      local_78 = (uint)bVar1;
      if (uVar7 < 0x200) {
        bVar2 = ""[uVar7 & 0x1ff];
      }
      local_7c = (uint)bVar2;
      iVar10 = (uint)d->m_huff_code_sizes[1][local_78] + iVar9;
      bit_buffer = (ulong)(uVar7 & mz_bitmasks[local_7c]) << ((byte)iVar10 & 0x3f) |
                   (ulong)d->m_huff_codes[1][local_78] << ((byte)iVar9 & 0x3f) |
                   (ulong)(uVar6 & mz_bitmasks[""[uVar6]]) << ((byte)iVar8 & 0x3f) |
                   (ulong)d->m_huff_codes[0][s_tdefl_len_sym[uVar6]] << ((byte)bits_in & 0x3f) |
                   bit_buffer;
      bits_in = local_7c + iVar10;
      pbVar12 = pLZ_codes + 3;
    }
    flags = uVar11;
    pLZ_codes = pbVar12;
    if (d->m_pOutput_buf_end <= pOutput_buf) break;
    *(mz_uint64 *)pOutput_buf = bit_buffer;
    pOutput_buf = pOutput_buf + (bits_in >> 3);
    bit_buffer = bit_buffer >> ((byte)bits_in & 0x38);
    bits_in = bits_in & 7;
    flags = flags >> 1;
  }
  return 0;
}

Assistant:

static mz_bool tdefl_compress_lz_codes(tdefl_compressor* d) {
  mz_uint flags;
  mz_uint8* pLZ_codes;
  mz_uint8* pOutput_buf = d->m_pOutput_buf;
  mz_uint8* pLZ_code_buf_end = d->m_pLZ_code_buf;
  mz_uint64 bit_buffer = d->m_bit_buffer;
  mz_uint bits_in = d->m_bits_in;

#define TDEFL_PUT_BITS_FAST(b, l)                \
  {                                              \
    bit_buffer |= (((mz_uint64)(b)) << bits_in); \
    bits_in += (l);                              \
  }

  flags = 1;
  for (pLZ_codes = d->m_lz_code_buf; pLZ_codes < pLZ_code_buf_end; flags >>= 1) {
    if (flags == 1)
      flags = *pLZ_codes++ | 0x100;

    if (flags & 1) {
      mz_uint s0, s1, n0, n1, sym, num_extra_bits;
      mz_uint match_len = pLZ_codes[0], match_dist = *(const mz_uint16*)(pLZ_codes + 1);
      pLZ_codes += 3;

      MZ_ASSERT(d->m_huff_code_sizes[0][s_tdefl_len_sym[match_len]]);
      TDEFL_PUT_BITS_FAST(d->m_huff_codes[0][s_tdefl_len_sym[match_len]], d->m_huff_code_sizes[0][s_tdefl_len_sym[match_len]]);
      TDEFL_PUT_BITS_FAST(match_len & mz_bitmasks[s_tdefl_len_extra[match_len]], s_tdefl_len_extra[match_len]);

      // This sequence coaxes MSVC into using cmov's vs. jmp's.
      s0 = s_tdefl_small_dist_sym[match_dist & 511];
      n0 = s_tdefl_small_dist_extra[match_dist & 511];
      s1 = s_tdefl_large_dist_sym[match_dist >> 8];
      n1 = s_tdefl_large_dist_extra[match_dist >> 8];
      sym = (match_dist < 512) ? s0 : s1;
      num_extra_bits = (match_dist < 512) ? n0 : n1;

      MZ_ASSERT(d->m_huff_code_sizes[1][sym]);
      TDEFL_PUT_BITS_FAST(d->m_huff_codes[1][sym], d->m_huff_code_sizes[1][sym]);
      TDEFL_PUT_BITS_FAST(match_dist & mz_bitmasks[num_extra_bits], num_extra_bits);
    } else {
      mz_uint lit = *pLZ_codes++;
      MZ_ASSERT(d->m_huff_code_sizes[0][lit]);
      TDEFL_PUT_BITS_FAST(d->m_huff_codes[0][lit], d->m_huff_code_sizes[0][lit]);

      if (((flags & 2) == 0) && (pLZ_codes < pLZ_code_buf_end)) {
        flags >>= 1;
        lit = *pLZ_codes++;
        MZ_ASSERT(d->m_huff_code_sizes[0][lit]);
        TDEFL_PUT_BITS_FAST(d->m_huff_codes[0][lit], d->m_huff_code_sizes[0][lit]);

        if (((flags & 2) == 0) && (pLZ_codes < pLZ_code_buf_end)) {
          flags >>= 1;
          lit = *pLZ_codes++;
          MZ_ASSERT(d->m_huff_code_sizes[0][lit]);
          TDEFL_PUT_BITS_FAST(d->m_huff_codes[0][lit], d->m_huff_code_sizes[0][lit]);
        }
      }
    }

    if (pOutput_buf >= d->m_pOutput_buf_end)
      return MZ_FALSE;

    *(mz_uint64*)pOutput_buf = bit_buffer;
    pOutput_buf += (bits_in >> 3);
    bit_buffer >>= (bits_in & ~7);
    bits_in &= 7;
  }

#undef TDEFL_PUT_BITS_FAST

  d->m_pOutput_buf = pOutput_buf;
  d->m_bits_in = 0;
  d->m_bit_buffer = 0;

  while (bits_in) {
    mz_uint32 n = MZ_MIN(bits_in, 16);
    TDEFL_PUT_BITS((mz_uint)bit_buffer & mz_bitmasks[n], n);
    bit_buffer >>= n;
    bits_in -= n;
  }

  TDEFL_PUT_BITS(d->m_huff_codes[0][256], d->m_huff_code_sizes[0][256]);

  return (d->m_pOutput_buf < d->m_pOutput_buf_end);
}